

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
despot::HierarchyCPT::IsIdentityUnderConstraint(HierarchyCPT *this,NamedVar *var,int value)

{
  pointer ppTVar1;
  TabularCPT *pTVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (*(this->super_CPT).super_Function.parents_.
       super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
       super__Vector_impl_data._M_start == var) {
    pTVar2 = (this->cpts_).
             super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl
             .super__Vector_impl_data._M_start[value];
    uVar4 = (**(code **)((long)(pTVar2->super_CPT).super_Function._vptr_Function + 0x80))
                      (pTVar2,var,value);
    return (bool)uVar4;
  }
  ppTVar1 = (this->cpts_).
            super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar8 = (this->cpts_).
          super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl.
          super__Vector_impl_data._M_finish == ppTVar1;
  if ((!bVar8) &&
     (pTVar2 = *ppTVar1,
     iVar5 = (*(pTVar2->super_CPT).super_Function._vptr_Function[0x10])
                       (pTVar2,var,(ulong)(uint)value), (char)iVar5 != '\0')) {
    uVar7 = 1;
    do {
      ppTVar1 = (this->cpts_).
                super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->cpts_).
                    super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3;
      bVar8 = uVar6 <= uVar7;
      if (uVar6 <= uVar7) {
        return bVar8;
      }
      pTVar2 = ppTVar1[uVar7];
      cVar3 = (**(code **)((long)(pTVar2->super_CPT).super_Function._vptr_Function + 0x80))
                        (pTVar2,var,value);
      uVar7 = uVar7 + 1;
    } while (cVar3 != '\0');
  }
  return bVar8;
}

Assistant:

bool HierarchyCPT::IsIdentityUnderConstraint(const NamedVar* var,
	int value) const {
	if (var == parents_[0])
		return cpts_[value]->IsIdentityUnderConstraint(var, value);

	for (int i = 0; i < cpts_.size(); i++)
		if (!cpts_[i]->IsIdentityUnderConstraint(var, value))
			return false;
	return true;
}